

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::String::String(String *this,String *other)

{
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  String *in_RDI;
  
  copy(in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

String::String(const String& other) { copy(other); }